

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall ot::commissioner::coap::Coap::HandleRequest(Coap *this,Request *aRequest)

{
  Coap *pCVar1;
  undefined4 uVar2;
  char *pcVar3;
  Response *pRVar4;
  iterator iVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar8;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  Error error;
  string uriPath;
  writer write;
  undefined1 local_148 [8];
  char *local_140;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  code *local_120;
  code *local_118;
  Coap *local_110;
  string local_108;
  undefined1 local_e8 [8];
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  Response *local_c0;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  Error local_58;
  
  local_e0._M_p = (pointer)&local_d0;
  local_e8._0_4_ = kNone;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_110 = this;
  Message::GetOption((Error *)local_148,aRequest,&local_98,kUriPath);
  local_e8._0_4_ = local_148._0_4_;
  std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_140);
  uVar2 = local_e8._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140 != &aStack_130) {
    operator_delete(local_140);
  }
  pCVar1 = local_110;
  if (uVar2 == kNone) {
    pRVar4 = ResponsesCache::Match(&local_110->mResponsesCache,aRequest);
    if (pRVar4 == (Response *)0x0) {
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
              ::find(&(pCVar1->mResources)._M_t,&local_98);
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(pCVar1->mResources)._M_t._M_impl.super__Rb_tree_header) {
        if ((pCVar1->mDefaultHandler).super__Function_base._M_manager == (_Manager_type)0x0) {
          SendHeaderResponse(&local_58,pCVar1,kNotFound,aRequest);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
            operator_delete(local_58.mMessage._M_dataplus._M_p);
          }
        }
        else {
          (*(pCVar1->mDefaultHandler)._M_invoker)((_Any_data *)&pCVar1->mDefaultHandler,aRequest);
        }
      }
      else if (iVar5._M_node[3]._M_left != (_Base_ptr)0x0) {
        (*(code *)iVar5._M_node[3]._M_right)(iVar5._M_node + 3,aRequest);
      }
      local_148 = (undefined1  [8])((ulong)(uint)local_148._4_4_ << 0x20);
      local_138 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x0;
      aStack_130._M_allocated_capacity = aStack_130._M_allocated_capacity & 0xffffffffffffff00;
      local_e8._0_4_ = kNone;
      local_140 = (char *)&aStack_130;
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140 == &aStack_130) goto LAB_0014ff19;
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      local_c0 = pRVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"coap","");
      local_148 = (undefined1  [8])0xd0000000e;
      pcVar6 = "server(={}) found cached CoAP response for resource {}";
      local_140 = "server(={}) found cached CoAP response for resource {}";
      local_138 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x36;
      aStack_130._M_allocated_capacity = 0x200000000;
      local_120 = ::fmt::v10::detail::
                  parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
      local_118 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      aStack_130._8_8_ = local_148;
      local_78._0_8_ =
           (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_148;
      do {
        if (pcVar6 == "") break;
        pcVar7 = pcVar6;
        if (*pcVar6 == '{') {
LAB_0014fe2a:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_78,pcVar6,pcVar7);
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                             (pcVar7,"",
                              (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_148);
          bVar8 = true;
        }
        else {
          pcVar7 = pcVar6 + 1;
          bVar8 = pcVar7 != "";
          if (bVar8) {
            if (*pcVar7 != '{') {
              pcVar3 = pcVar6 + 2;
              do {
                pcVar7 = pcVar3;
                bVar8 = pcVar7 != "";
                if (pcVar7 == "") goto LAB_0014fe26;
                pcVar3 = pcVar7 + 1;
              } while (*pcVar7 != '{');
            }
            bVar8 = true;
          }
LAB_0014fe26:
          if (bVar8) goto LAB_0014fe2a;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_78,pcVar6,"");
          bVar8 = false;
        }
      } while (bVar8);
      pCVar1 = local_110;
      local_148 = (undefined1  [8])local_110;
      local_138 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_98._M_dataplus._M_p;
      aStack_130._M_allocated_capacity = local_98._M_string_length;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_148;
      fmt.size_ = 0xde;
      fmt.data_ = (char *)0x36;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"server(={}) found cached CoAP response for resource {}",fmt,args)
      ;
      Log(kInfo,&local_108,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      Send((Error *)local_148,pCVar1,local_c0);
      local_e8._0_4_ = local_148._0_4_;
      std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140 == &aStack_130) goto LAB_0014ff19;
    }
    operator_delete(local_140);
  }
LAB_0014ff19:
  if (local_e8._0_4_ != kNone) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"coap","");
    local_148 = (undefined1  [8])0xd0000000e;
    pcVar6 = "server(={}) handle request failed: {}";
    local_140 = "server(={}) handle request failed: {}";
    local_138 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x25;
    aStack_130._M_allocated_capacity = 0x200000000;
    local_120 = ::fmt::v10::detail::
                parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
    local_118 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    aStack_130._8_8_ = local_148;
    local_78._0_8_ =
         (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_148;
    do {
      if (pcVar6 == "") break;
      pcVar7 = pcVar6;
      if (*pcVar6 == '{') {
LAB_0014ffe4:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_78,pcVar6,pcVar7);
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                           (pcVar7,"",
                            (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_148);
        bVar8 = true;
      }
      else {
        pcVar7 = pcVar6 + 1;
        bVar8 = pcVar7 != "";
        if (bVar8) {
          if (*pcVar7 != '{') {
            pcVar3 = pcVar6 + 2;
            do {
              pcVar7 = pcVar3;
              bVar8 = pcVar7 != "";
              if (pcVar7 == "") goto LAB_0014ffe0;
              pcVar3 = pcVar7 + 1;
            } while (*pcVar7 != '{');
          }
          bVar8 = true;
        }
LAB_0014ffe0:
        if (bVar8) goto LAB_0014ffe4;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_78,pcVar6,"");
        bVar8 = false;
      }
    } while (bVar8);
    Error::ToString_abi_cxx11_((string *)local_78,(Error *)local_e8);
    local_148 = (undefined1  [8])local_110;
    local_138 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_78._0_8_;
    aStack_130._M_allocated_capacity = local_78._8_8_;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_148;
    fmt_00.size_ = 0xde;
    fmt_00.data_ = (char *)0x25;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"server(={}) handle request failed: {}",fmt_00,args_00);
    Log(kInfo,&local_108,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_78._0_8_ !=
        (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p);
  }
  return;
}

Assistant:

void Coap::HandleRequest(const Request &aRequest)
{
    Error                                error;
    const Response                      *response = nullptr;
    std::string                          uriPath;
    decltype(mResources)::const_iterator resource;

    SuccessOrExit(error = aRequest.GetUriPath(uriPath));

    response = mResponsesCache.Match(aRequest);
    if (response != nullptr)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) found cached CoAP response for resource {}", static_cast<void *>(this),
                 uriPath);
        ExitNow(error = Send(*response));
    }

    resource = mResources.find(uriPath);
    if (resource != mResources.end())
    {
        resource->second.HandleRequest(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else if (mDefaultHandler != nullptr)
    {
        mDefaultHandler(aRequest);
        ExitNow(error = ERROR_NONE);
    }
    else
    {
        IgnoreError(SendNotFound(aRequest));
        ExitNow(error = ERROR_NONE);
    }

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_INFO(LOG_REGION_COAP, "server(={}) handle request failed: {}", static_cast<void *>(this), error.ToString());
    }
}